

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStencilbufferTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BasicFboStencilCase::render(BasicFboStencilCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int width;
  int height;
  int i_1;
  deUint32 program;
  deUint32 program_00;
  Context *pCVar1;
  int i;
  long lVar2;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  undefined1 local_318 [8];
  ulong uStack_310;
  Vec4 local_308;
  Surface *local_2f0;
  TextureFormat local_2e8;
  FlatColorShader flatShader;
  GradientShader gradShader;
  
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar1->_vptr_Context[0x75])(pCVar1,&flatShader);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  program_00 = (*pCVar1->_vptr_Context[0x75])(pCVar1,&gradShader);
  fbo = 0;
  colorRbo = 0;
  depthStencilRbo = 0;
  local_2f0 = dst;
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  sglr::ContextWrapper::glRenderbufferStorage
            (this_00,0x8d41,0x8058,(this->m_size).m_data[0],(this->m_size).m_data[1]);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthStencilRbo);
  sglr::ContextWrapper::glRenderbufferStorage
            (this_00,0x8d41,this->m_format,(this->m_size).m_data[0],(this->m_size).m_data[1]);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,depthStencilRbo);
  if (this->m_useDepth == true) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthStencilRbo);
  }
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glViewport(this_00,0,0,(this->m_size).m_data[0],(this->m_size).m_data[1]);
  local_318._0_4_ = 0.0;
  local_318._4_4_ = 0.0;
  uStack_310._0_4_ = 0.0;
  uStack_310._4_4_ = 0.0;
  sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,(float *)local_318);
  sglr::ContextWrapper::glClearBufferfi(this_00,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,0,0xff);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e02);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = 1.0;
  local_318._4_4_ = 0.0;
  uStack_310 = 0x3f80000000000000;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar1,program,(Vec4 *)local_318);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = -1.0;
  local_318._4_4_ = -1.0;
  uStack_310 = uStack_310 & 0xffffffff00000000;
  local_308.m_data._0_8_ = &DAT_3f8000003f800000;
  local_308.m_data._8_8_ = (ulong)(uint)local_308.m_data[3] << 0x20;
  sglr::drawQuad(pCVar1,program,(Vec3 *)local_318,(Vec3 *)&local_308);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = 0.0;
  local_318._4_4_ = 0.0;
  uStack_310._0_4_ = 0.0;
  uStack_310._4_4_ = 0.0;
  lVar2 = 0;
  do {
    local_308.m_data[lVar2] = 1.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar1,program_00,(Vec4 *)local_318,&local_308);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = -1.0;
  local_318._4_4_ = -1.0;
  uStack_310 = CONCAT44(uStack_310._4_4_,-1.0);
  local_308.m_data._0_8_ = &DAT_3f8000003f800000;
  local_308.m_data[2] = 1.0;
  sglr::drawQuad(pCVar1,program_00,(Vec3 *)local_318,(Vec3 *)&local_308);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glStencilFunc(this_00,0x202,this->m_useDepth + 1,0xff);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e03,0x1e00,0x1e00);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = 0.0;
  local_318._4_4_ = 1.0;
  uStack_310 = 0x3f80000000000000;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar1,program,(Vec4 *)local_318);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = -0.5;
  local_318._4_4_ = -0.5;
  uStack_310 = uStack_310 & 0xffffffff00000000;
  local_308.m_data._0_8_ = &DAT_3f0000003f000000;
  local_308.m_data[2] = 0.0;
  sglr::drawQuad(pCVar1,program,(Vec3 *)local_318,(Vec3 *)&local_308);
  sglr::ContextWrapper::glStencilFunc(this_00,0x204,2 - (uint)this->m_useDepth,0xff);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = 0.0;
  local_318._4_4_ = 0.0;
  uStack_310 = (ulong)&DAT_3f8000003f800000;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar1,program,(Vec4 *)local_318);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_318._0_4_ = -1.0;
  local_318._4_4_ = -1.0;
  uStack_310 = uStack_310 & 0xffffffff00000000;
  local_308.m_data._0_8_ = &DAT_3f8000003f800000;
  local_308.m_data._8_8_ = (ulong)(uint)local_308.m_data[3] << 0x20;
  sglr::drawQuad(pCVar1,program,(Vec3 *)local_318,(Vec3 *)&local_308);
  width = (this->m_size).m_data[0];
  height = (this->m_size).m_data[1];
  local_2e8 = glu::mapGLInternalFormat(0x8058);
  lVar2 = 0;
  do {
    *(undefined4 *)(local_318 + lVar2 * 4) = 0x3f800000;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_308.m_data[0] = 0.0;
  local_308.m_data[1] = 0.0;
  local_308.m_data[2] = 0.0;
  local_308.m_data[3] = 0.0;
  FboTestCase::readPixels
            (&this->super_FboTestCase,local_2f0,0,0,width,height,&local_2e8,(Vec4 *)local_318,
             &local_308);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32			colorFormat		= GL_RGBA8;

		GradientShader			gradShader		(glu::TYPE_FLOAT_VEC4);
		FlatColorShader			flatShader		(glu::TYPE_FLOAT_VEC4);
		deUint32				flatShaderID	= getCurrentContext()->createProgram(&flatShader);
		deUint32				gradShaderID	= getCurrentContext()->createProgram(&gradShader);

		deUint32				fbo				= 0;
		deUint32				colorRbo		= 0;
		deUint32				depthStencilRbo	= 0;

		// Colorbuffer.
		glGenRenderbuffers(1, &colorRbo);
		glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, m_size.x(), m_size.y());

		// Stencil (and depth) buffer.
		glGenRenderbuffers(1, &depthStencilRbo);
		glBindRenderbuffer(GL_RENDERBUFFER, depthStencilRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, m_format, m_size.x(), m_size.y());

		// Framebuffer.
		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
		if (m_useDepth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_size.x(), m_size.y());

		// Clear framebuffer.
		glClearBufferfv(GL_COLOR, 0, Vec4(0.0f).getPtr());
		glClearBufferfi(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		// Render intersecting quads - increment stencil on depth pass
		glEnable(GL_DEPTH_TEST);
		glEnable(GL_STENCIL_TEST);
		glStencilFunc(GL_ALWAYS, 0, 0xffu);
		glStencilOp(GL_KEEP, GL_KEEP, GL_INCR);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f,  0.0f), Vec3(+1.0f, +1.0f,  0.0f));

		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(+1.0f, +1.0f, +1.0f));

		glDisable(GL_DEPTH_TEST);

		// Draw quad with stencil test (stencil == 1 or 2 depending on depth) - decrement on stencil failure
		glStencilFunc(GL_EQUAL, m_useDepth ? 2 : 1, 0xffu);
		glStencilOp(GL_DECR, GL_KEEP, GL_KEEP);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-0.5f, -0.5f, 0.0f), Vec3(+0.5f, +0.5f, 0.0f));

		// Draw quad with stencil test where stencil > 1 or 2 depending on depth buffer
		glStencilFunc(GL_GREATER, m_useDepth ? 1 : 2, 0xffu);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

		readPixels(dst, 0, 0, m_size.x(), m_size.y(), glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}